

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::ReLUParameter::InternalSwap(ReLUParameter *this,ReLUParameter *other)

{
  float fVar1;
  int iVar2;
  uint32 uVar3;
  void *pvVar4;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar5;
  void *pvVar6;
  UnknownFieldSet *pUVar7;
  UnknownFieldSet *pUVar8;
  
  fVar1 = this->negative_slope_;
  this->negative_slope_ = other->negative_slope_;
  other->negative_slope_ = fVar1;
  iVar2 = this->engine_;
  this->engine_ = other->engine_;
  other->engine_ = iVar2;
  uVar3 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar3;
  pvVar6 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  pvVar4 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar6 & 1) == 0) {
    if (((ulong)pvVar4 & 1) == 0) goto LAB_004164d8;
LAB_004164c0:
    pUVar8 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar4 & 1) != 0) goto LAB_004164c0;
    pUVar8 = google::protobuf::internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(other->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
    pvVar6 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
  }
  if (((ulong)pvVar6 & 1) == 0) {
    pUVar7 = google::protobuf::internal::
             InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
  }
  else {
    pUVar7 = (UnknownFieldSet *)((ulong)pvVar6 & 0xfffffffffffffffe);
  }
  pvVar5 = pUVar7->fields_;
  pUVar7->fields_ = pUVar8->fields_;
  pUVar8->fields_ = pvVar5;
LAB_004164d8:
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void ReLUParameter::InternalSwap(ReLUParameter* other) {
  std::swap(negative_slope_, other->negative_slope_);
  std::swap(engine_, other->engine_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}